

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLDefectsTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLDefectsTest_parse_light_object_issue38_Test::
~OpenDDLDefectsTest_parse_light_object_issue38_Test
          (OpenDDLDefectsTest_parse_light_object_issue38_Test *this)

{
  OpenDDLDefectsTest_parse_light_object_issue38_Test *this_local;
  
  ~OpenDDLDefectsTest_parse_light_object_issue38_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F( OpenDDLDefectsTest, parse_light_object_issue38 ) {
    char token[] = {
        "LightObject $light1( type = \"point\" ) // Lamp\n"
        "{\n"
        "    Color( attrib = \"light\" ) { float[ 3 ]{ { 1.0, 1.0, 1.0 } } }\n"
        "\n"
        "    Atten( curve = \"inverse_square\" )\n"
        "    {\n"
        "        Param( attrib = \"scale\" ) { float{ 5.47722400800463 } }\n"
        "    }\n"
        "}\n"
    };
    
    OpenDDLParser myParser;
    myParser.setBuffer( token, strlen( token ) );
    const bool ok( myParser.parse() );
    EXPECT_TRUE( ok );
    DDLNode *root = myParser.getRoot();
    EXPECT_TRUE(nullptr != root);

}